

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O1

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,MethodInvocation *method_invocation)

{
  string *__rhs;
  NewScopeLayer *pNVar1;
  pointer pcVar2;
  element_type *peVar3;
  PrimitiveSimpleObject *this_00;
  MethodExpression *pMVar4;
  pointer ppEVar5;
  NewScopeLayerTree *tree;
  MethodDeclaration *pMVar6;
  Formals *pFVar7;
  ListOfStatements *pLVar8;
  bool bVar9;
  int iVar10;
  ostream *poVar11;
  mapped_type *pmVar12;
  PrimitiveSimpleObject *this_01;
  ClassStorage *this_02;
  iterator iVar13;
  mapped_type *pmVar14;
  Value *pVVar15;
  VariableValue *this_main;
  long *plVar16;
  mapped_type *ppNVar17;
  runtime_error *prVar18;
  size_type *psVar19;
  PrimitiveSimpleObject *this_03;
  Expression **expr;
  pointer ppEVar20;
  mapped_type method;
  Symbol class_symbol;
  vector<Value_*,_std::allocator<Value_*>_> parameters;
  NewFunctionProcessingVisitor new_visitor;
  unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
  methods;
  shared_ptr<Method> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  Symbol local_368;
  vector<Value_*,_std::allocator<Value_*>_> local_348;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  Symbol local_250;
  string local_230;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [2];
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::stack<int,_std::deque<int,_std::allocator<int>_>_>_>,_std::allocator<std::pair<const_Symbol,_std::stack<int,_std::deque<int,_std::allocator<int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1d8;
  deque<Symbol,_std::allocator<Symbol>_> local_1a0;
  FrameEmulator local_150;
  _Deque_base<int,_std::allocator<int>_> local_b8;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(method_invocation->method_name_)._M_dataplus._M_p,
                       (method_invocation->method_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11," called!",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  local_368.name_._M_dataplus._M_p = (pointer)&local_368.name_.field_2;
  local_368.name_._M_string_length = 0;
  local_368.name_.field_2._M_local_buf[0] = '\0';
  __rhs = &method_invocation->call_from_;
  iVar10 = std::__cxx11::string::compare((char *)__rhs);
  pNVar1 = this->current_layer_;
  if (iVar10 == 0) {
    std::__cxx11::string::_M_assign((string *)&local_368);
  }
  else {
    pcVar2 = (method_invocation->call_from_)._M_dataplus._M_p;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar2,pcVar2 + (method_invocation->call_from_)._M_string_length
              );
    Symbol::Symbol((Symbol *)local_210,&local_290);
    bVar9 = NewScopeLayer::HasVariable(pNVar1,(Symbol *)local_210);
    if ((Value *)local_210._0_8_ != (Value *)(local_210 + 0x10)) {
      operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if (!bVar9) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar18,"Can\'t call methods from undeclared variable");
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pNVar1 = this->current_layer_;
    pcVar2 = (method_invocation->call_from_)._M_dataplus._M_p;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,pcVar2,pcVar2 + (method_invocation->call_from_)._M_string_length
              );
    Symbol::Symbol((Symbol *)local_210,&local_2b0);
    pmVar12 = std::__detail::
              _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<PrimitiveObject>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pNVar1->variables_,(key_type *)local_210);
    peVar3 = (pmVar12->super___shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (PrimitiveSimpleObject *)
              (pmVar12->super___shared_ptr<PrimitiveObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              ._M_pi;
    if (this_00 != (PrimitiveSimpleObject *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_00->type_ = *(int *)&this_00->type_ + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_00->type_ = *(int *)&this_00->type_ + 1;
      }
    }
    if ((Value *)local_210._0_8_ != (Value *)(local_210 + 0x10)) {
      operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    iVar10 = (*(peVar3->super_Object)._vptr_Object[4])(peVar3);
    if ((char)iVar10 != '\0') {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                     "Can\'t call methods from array object: ",__rhs);
      std::runtime_error::runtime_error(prVar18,(string *)local_210);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = (PrimitiveSimpleObject *)
              __dynamic_cast(peVar3,&PrimitiveObject::typeinfo,&PrimitiveSimpleObject::typeinfo,0);
    this_03 = this_01;
    if (this_01 != (PrimitiveSimpleObject *)0x0) {
      this_03 = this_00;
    }
    if (this_01 != (PrimitiveSimpleObject *)0x0 && this_00 != (PrimitiveSimpleObject *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_00->type_ = *(int *)&this_00->type_ + 1;
        UNLOCK();
        this_03 = this_00;
      }
      else {
        *(int *)&this_00->type_ = *(int *)&this_00->type_ + 1;
        this_03 = this_00;
      }
    }
    bVar9 = PrimitiveSimpleObject::IsClass(this_01);
    if (!bVar9) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                     "Can\'t call methods from non-class object: ",__rhs);
      std::runtime_error::runtime_error(prVar18,(string *)local_210);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (**(this_01->super_PrimitiveObject).super_Object._vptr_Object)(&local_230,this_01);
    Symbol::Symbol((Symbol *)local_210,&local_230);
    std::__cxx11::string::_M_assign((string *)&local_368);
    if ((Value *)local_210._0_8_ != (Value *)(local_210 + 0x10)) {
      operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (this_03 != (PrimitiveSimpleObject *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_03);
    }
    if (this_00 != (PrimitiveSimpleObject *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
  }
  this_02 = ClassStorage::GetInstance();
  ClassStorage::GetMethods
            ((unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
              *)&local_68,this_02,&local_368);
  pcVar2 = (method_invocation->method_name_)._M_dataplus._M_p;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar2,pcVar2 + (method_invocation->method_name_)._M_string_length
            );
  Symbol::Symbol((Symbol *)local_210,&local_2d0);
  iVar13 = std::
           _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&local_68,(key_type *)local_210);
  if ((Value *)local_210._0_8_ != (Value *)(local_210 + 0x10)) {
    operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if (iVar13.super__Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Method>_>,_true>.
      _M_cur == (__node_type *)0x0) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_3a8,"Can\'t call ",&method_invocation->method_name_);
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_3a8);
    local_388._M_dataplus._M_p = (pointer)*plVar16;
    psVar19 = (size_type *)(plVar16 + 2);
    if ((size_type *)local_388._M_dataplus._M_p == psVar19) {
      local_388.field_2._M_allocated_capacity = *psVar19;
      local_388.field_2._8_8_ = plVar16[3];
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    }
    else {
      local_388.field_2._M_allocated_capacity = *psVar19;
    }
    local_388._M_string_length = plVar16[1];
    *plVar16 = (long)psVar19;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                   &local_388,__rhs);
    std::runtime_error::runtime_error(prVar18,(string *)local_210);
    __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_348.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_348.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_348.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pMVar4 = method_invocation->arguments_list_;
  if (pMVar4 != (MethodExpression *)0x0) {
    ppEVar20 = (pMVar4->list_of_expressions_).
               super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppEVar5 = (pMVar4->list_of_expressions_).
              super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppEVar20 != ppEVar5) {
      do {
        local_210._0_8_ =
             TemplateVisitor<Value_*>::Accept
                       (&this->super_TemplateVisitor<Value_*>,&(*ppEVar20)->super_Node);
        std::vector<Value*,std::allocator<Value*>>::emplace_back<Value*>
                  ((vector<Value*,std::allocator<Value*>> *)&local_348,(Value **)local_210);
        ppEVar20 = ppEVar20 + 1;
      } while (ppEVar20 != ppEVar5);
    }
  }
  pcVar2 = (method_invocation->method_name_)._M_dataplus._M_p;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,pcVar2,pcVar2 + (method_invocation->method_name_)._M_string_length
            );
  Symbol::Symbol((Symbol *)local_210,&local_2f0);
  pmVar14 = std::__detail::
            _Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&local_68,(key_type *)local_210);
  local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pmVar14->super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (pmVar14->super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  if ((Value *)local_210._0_8_ != (Value *)(local_210 + 0x10)) {
    operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  iVar10 = std::__cxx11::string::compare((char *)__rhs);
  if (iVar10 == 0) {
    this_main = this->this_;
  }
  else {
    pcVar2 = (method_invocation->call_from_)._M_dataplus._M_p;
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310,pcVar2,pcVar2 + (method_invocation->call_from_)._M_string_length
              );
    Symbol::Symbol(&local_250,&local_310);
    iVar10 = FunctionTable::Get(&this->table_,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.name_._M_dataplus._M_p != &local_250.name_.field_2) {
      operator_delete(local_250.name_._M_dataplus._M_p,
                      local_250.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    pVVar15 = FrameEmulator::Get(&this->frame_,iVar10);
    if (pVVar15 == (Value *)0x0) {
      this_main = (VariableValue *)0x0;
    }
    else {
      this_main = (VariableValue *)
                  __dynamic_cast(pVVar15,&Value::typeinfo,&VariableValue::typeinfo,0);
    }
  }
  tree = this->tree_;
  Symbol::GetName_abi_cxx11_(&local_270,&local_368);
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_270);
  psVar19 = (size_type *)(plVar16 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_3a8.field_2._M_allocated_capacity = *psVar19;
    local_3a8.field_2._8_8_ = plVar16[3];
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  }
  else {
    local_3a8.field_2._M_allocated_capacity = *psVar19;
    local_3a8._M_dataplus._M_p = (pointer)*plVar16;
  }
  local_3a8._M_string_length = plVar16[1];
  *plVar16 = (long)psVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_3a8,
                               (ulong)(method_invocation->method_name_)._M_dataplus._M_p);
  psVar19 = (size_type *)(plVar16 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_330.field_2._M_allocated_capacity = *psVar19;
    local_330.field_2._8_8_ = plVar16[3];
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  }
  else {
    local_330.field_2._M_allocated_capacity = *psVar19;
    local_330._M_dataplus._M_p = (pointer)*plVar16;
  }
  local_330._M_string_length = plVar16[1];
  *plVar16 = (long)psVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  Symbol::Symbol((Symbol *)&local_388,&local_330);
  ppNVar17 = std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_NewScopeLayer_*>,_std::allocator<std::pair<const_Symbol,_NewScopeLayer_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_NewScopeLayer_*>,_std::allocator<std::pair<const_Symbol,_NewScopeLayer_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&tree->layer_mapping_,(key_type *)&local_388);
  NewFunctionProcessingVisitor
            ((NewFunctionProcessingVisitor *)local_210,tree,*ppNVar17,&local_3b8,this_main);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  FrameEmulator::SetParameters(&local_150,&local_348);
  FrameEmulator::SetParentFrame(&local_150,&this->frame_);
  pMVar6 = (local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           method_declaration_;
  pFVar7 = pMVar6->formals_;
  if (pFVar7 != (Formals *)0x0) {
    (**(pFVar7->super_Node)._vptr_Node)(pFVar7,local_210);
  }
  pLVar8 = pMVar6->list_of_statements_;
  (**(pLVar8->super_Statement).super_Node._vptr_Node)(pLVar8,local_210);
  pVVar15 = FrameEmulator::GetReturnValue(&this->frame_);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = pVVar15;
  local_210._0_8_ = &PTR_Visit_0016e478;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_b8);
  if (local_150.variables_.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.variables_.super__Vector_base<Value_*,_std::allocator<Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.variables_.super__Vector_base<Value_*,_std::allocator<Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.variables_.super__Vector_base<Value_*,_std::allocator<Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_150.parameters_.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.parameters_.super__Vector_base<Value_*,_std::allocator<Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.parameters_.
                          super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.parameters_.
                          super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&local_150);
  std::deque<Symbol,_std::allocator<Symbol>_>::~deque(&local_1a0);
  std::
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::stack<int,_std::deque<int,_std::allocator<int>_>_>_>,_std::allocator<std::pair<const_Symbol,_std::stack<int,_std::deque<int,_std::allocator<int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1d8);
  if (local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3b8.super___shared_ptr<Method,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_348.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Method>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.name_._M_dataplus._M_p != &local_368.name_.field_2) {
    operator_delete(local_368.name_._M_dataplus._M_p,
                    CONCAT71(local_368.name_.field_2._M_allocated_capacity._1_7_,
                             local_368.name_.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(MethodInvocation* method_invocation) {
  std::cout << method_invocation->method_name_ << " called!" << std::endl;

  Symbol class_symbol;
  if (method_invocation->call_from_ == "this") {
    class_symbol = current_layer_->class_symbol_;
  } else {
    if (!current_layer_->HasVariable(Symbol(method_invocation->call_from_))) {
      throw std::runtime_error("Can't call methods from undeclared variable");
    }

    auto variable =
        current_layer_->variables_[Symbol(method_invocation->call_from_)];
    if (variable->IsArray()) {
      throw std::runtime_error("Can't call methods from array object: " +
                               method_invocation->call_from_);
    }

    auto casted_var =
        std::dynamic_pointer_cast<PrimitiveSimpleObject>(variable);
    if (!casted_var->IsClass()) {
      throw std::runtime_error("Can't call methods from non-class object: " +
                               method_invocation->call_from_);
    }

    class_symbol = Symbol(casted_var->GetTypename());
  }

  auto methods = ClassStorage::GetInstance().GetMethods(class_symbol);
  if (methods.find(Symbol(method_invocation->method_name_)) == methods.end()) {
    throw std::runtime_error("Can't call " + method_invocation->method_name_ +
                             " from " + method_invocation->call_from_);
  }

  std::vector<Value*> parameters;
  if (method_invocation->arguments_list_) {
    for (auto&& expr :
         method_invocation->arguments_list_->list_of_expressions_) {
      parameters.emplace_back(Accept(expr));
    }
  }

  auto method = methods[Symbol(method_invocation->method_name_)];

  VariableValue* class_obj;
  if (method_invocation->call_from_ == "this") {
    class_obj = this_;
  } else {
    int index = table_.Get(Symbol(method_invocation->call_from_));
    class_obj = dynamic_cast<VariableValue*>(frame_.Get(index));
  }

  NewFunctionProcessingVisitor new_visitor(
      tree_,
      tree_->layer_mapping_[Symbol(class_symbol.GetName() + "$" +
                                   method_invocation->method_name_)],
      method, class_obj);

  new_visitor.SetParameters(parameters);
  new_visitor.GetFrame().SetParentFrame(&frame_);
  new_visitor.Visit(method->method_declaration_);
  tos_value_ = frame_.GetReturnValue();
}